

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.h
# Opt level: O1

void __thiscall NaPNSum::~NaPNSum(NaPNSum *this)

{
  *(code **)this = NaPNRandomGen::set_gauss_distrib;
  NaVector::~NaVector((NaVector *)(this + 0x170));
  NaVector::~NaVector((NaVector *)(this + 0x158));
  NaPetriCnOutput::~NaPetriCnOutput((NaPetriCnOutput *)(this + 0xd8));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x90));
  NaPetriCnInput::~NaPetriCnInput((NaPetriCnInput *)(this + 0x48));
  NaPetriNode::~NaPetriNode((NaPetriNode *)this);
  return;
}

Assistant:

class PNNA_API NaPNSum : public NaPetriNode
{
public:

    // Create node for Petri network
    NaPNSum (const char* szNodeName = "sum");


    ////////////////
    // Connectors //
    ////////////////

    // Input (mainstream)
    NaPetriCnInput      main;

    // Another input
    NaPetriCnInput      aux;

    // Output (mainstream)
    NaPetriCnOutput     sum;


    ///////////////////
    // Quick linkage //
    ///////////////////

    // Return mainstream input connector (the only input or NULL)
    virtual NaPetriConnector*   main_input_cn ();


    ///////////////////
    // Node specific //
    ///////////////////

    // Assign gain weights on input; ones by default
    virtual void        set_gain (const NaVector& vMainK,
				  const NaVector& vAuxK);


    ///////////////////////
    // Phases of network //
    ///////////////////////

    // 2. Link connectors inside the node
    virtual void        relate_connectors ();

    // 5. Verification to be sure all is OK (true)
    virtual bool        verify ();

    // 8. True action of the node (if activate returned true)
    virtual void        action ();

protected:/* data */

    // Gain for main and auxiliary inputs
    NaVector		vMainGain, vAuxGain;

}